

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticmodel.cpp
# Opt level: O2

int __thiscall ArithmeticBitModel::init(ArithmeticBitModel *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  
  this->bit_count = 2;
  this->update_cycle = 4;
  this->bits_until_update = 4;
  this->bit_0_prob = 0x1000;
  this->bit_0_count = 1;
  return in_EAX;
}

Assistant:

void ArithmeticBitModel::init()
{
  // initialization to equiprobable model
  bit_0_count = 1;
  bit_count   = 2;
  bit_0_prob  = 1U << (BM__LengthShift - 1);
  // start with frequent updates
  update_cycle = bits_until_update = 4;
}